

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_logger.cpp
# Opt level: O2

void __thiscall
ot::commissioner::SysLogger::Log(SysLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  int __pri;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  if (aLevel <= this->mLogLevel) {
    switch(aLevel) {
    case kOff:
      __pri = 0;
      break;
    case kCritical:
      __pri = 2;
      break;
    case kError:
      __pri = 3;
      break;
    case kWarn:
      __pri = 4;
      break;
    case kInfo:
      __pri = 6;
      break;
    case kDebug:
      __pri = 7;
      break;
    default:
      abort();
    }
    local_38 = local_28;
    local_30 = 0;
    local_28[0] = 0;
    std::__cxx11::string::assign((char *)&local_38);
    syslog(__pri,"%s [ %s ] %s",local_38,(aRegion->_M_dataplus)._M_p,(aMsg->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void SysLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    if (aLevel <= mLogLevel)
    {
        syslog(ToSysLogLevel(aLevel), "%s [ %s ] %s", ToString(aLevel).c_str(), aRegion.c_str(), aMsg.c_str());
    }
}